

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DensityHistogram.cpp
# Opt level: O1

void __thiscall OpenMD::DensityHistogram::process(DensityHistogram *this)

{
  Snapshot *pSVar1;
  iterator iVar2;
  pointer pdVar3;
  pointer pdVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  StuntDouble *pSVar8;
  ulong uVar9;
  pointer pdVar10;
  long lVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  double dVar14;
  vector<double,_std::allocator<double>_> density;
  RealType min;
  int ii;
  DumpReader reader;
  vector<double,_std::allocator<double>_> local_12c8;
  double local_12a8;
  double local_12a0;
  double local_1298;
  int local_128c;
  DumpReader local_1288;
  
  if ((this->evaluator_).isDynamic_ == true) {
    SelectionEvaluator::evaluate((SelectionSet *)&local_1288,&this->evaluator_);
    lVar11 = 0;
    do {
      std::vector<bool,_std::allocator<bool>_>::operator=
                ((vector<bool,_std::allocator<bool>_> *)
                 ((long)&(((this->seleMan_).ss_.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                         super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                         ._M_start.super__Bit_iterator_base._M_p + lVar11),
                 (vector<bool,_std::allocator<bool>_> *)
                 ((long)&(local_1288.info_)->_vptr_SimInfo + lVar11));
      lVar11 = lVar11 + 0x28;
    } while (lVar11 != 0xf0);
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
              ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)&local_1288);
  }
  DumpReader::DumpReader
            (&local_1288,(this->super_StaticAnalyser).info_,
             &(this->super_StaticAnalyser).dumpFilename_);
  iVar6 = DumpReader::getNFrames(&local_1288);
  iVar7 = iVar6 / (this->super_StaticAnalyser).step_;
  this->nProcessed_ = iVar7;
  local_12c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (double *)0x0;
  local_12c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (double *)0x0;
  local_12c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (double *)0x0;
  this->nProcessed_ = iVar7;
  local_1298 = (double)CONCAT44(local_1298._4_4_,iVar6);
  if (0 < iVar6) {
    iVar6 = 0;
    do {
      DumpReader::readFrame(&local_1288,iVar6);
      this->currentSnapshot_ = ((this->super_StaticAnalyser).info_)->sman_->currentSnapshot_;
      pSVar8 = SelectionManager::beginSelected(&this->seleMan_,&local_128c);
      while (pSVar8 != (StuntDouble *)0x0) {
        pSVar1 = pSVar8->snapshotMan_->currentSnapshot_;
        dVar14 = *(double *)
                  (*(long *)((long)&(pSVar1->atomData).density.
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_start + pSVar8->storage_) +
                  (long)pSVar8->localIndex_ * 8);
        if ((dVar14 != 0.0) || (NAN(dVar14))) {
          local_12a8 = *(double *)
                        (*(long *)((long)&(pSVar1->atomData).density.
                                          super__Vector_base<double,_std::allocator<double>_>.
                                          _M_impl.super__Vector_impl_data._M_start +
                                  pSVar8->storage_) + (long)pSVar8->localIndex_ * 8);
          if (local_12c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_12c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                      (&local_12c8,
                       (iterator)
                       local_12c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish,&local_12a8);
          }
          else {
            *local_12c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish = local_12a8;
            local_12c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_12c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
        }
        pSVar8 = SelectionManager::nextSelected(&this->seleMan_,&local_128c);
      }
      iVar6 = iVar6 + (this->super_StaticAnalyser).step_;
    } while (iVar6 < local_1298._0_4_);
  }
  if (local_12c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_start ==
      local_12c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_finish) {
    builtin_strncpy(painCave.errMsg,"Density for selected atom not found.\n",0x26);
    painCave.isFatal = 1;
    simError();
  }
  pdVar10 = local_12c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish;
  pdVar3 = local_12c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (local_12c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_start !=
      local_12c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_finish) {
    uVar9 = (long)local_12c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_12c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3;
    lVar11 = 0x3f;
    if (uVar9 != 0) {
      for (; uVar9 >> lVar11 == 0; lVar11 = lVar11 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_12c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start,
               local_12c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish,((uint)lVar11 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (pdVar3,pdVar10);
  }
  local_12a8 = *local_12c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
  dVar14 = (local_12c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish[-1] - local_12a8) / (double)this->nBins_;
  this->averageDensity_ = 0.0;
  if ((dVar14 != 0.0) || (NAN(dVar14))) {
    local_1298 = dVar14;
    if (-3 < this->nBins_) {
      iVar6 = -1;
      do {
        local_12a0 = (double)iVar6 * local_1298 + local_12a8;
        iVar2._M_current =
             (this->bincenter_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar2._M_current ==
            (this->bincenter_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    (&this->bincenter_,iVar2,&local_12a0);
        }
        else {
          *iVar2._M_current = local_12a0;
          (this->bincenter_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar2._M_current + 1;
        }
        local_12a0 = 0.0;
        iVar2._M_current =
             (this->histList_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar2._M_current ==
            (this->histList_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    (&this->histList_,iVar2,&local_12a0);
        }
        else {
          *iVar2._M_current = 0.0;
          (this->histList_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar2._M_current + 1;
        }
        iVar6 = iVar6 + 1;
      } while (iVar6 < this->nBins_ + 2);
    }
    uVar9 = 0;
    if (local_12c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start <
        local_12c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      lVar11 = (long)local_12c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_12c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3;
      auVar12._8_4_ =
           (int)((long)local_12c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)local_12c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start >> 0x23);
      auVar12._0_8_ = lVar11;
      auVar12._12_4_ = 0x45300000;
      pdVar3 = (this->bincenter_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar10 = local_12c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      do {
        pdVar4 = (this->histList_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        do {
          iVar6 = (int)uVar9;
          dVar14 = pdVar3[iVar6];
          if ((*pdVar10 < dVar14) || (pdVar3[(long)iVar6 + 1] <= *pdVar10)) {
            this->averageDensity_ = dVar14 * pdVar4[iVar6] + this->averageDensity_;
            bVar5 = true;
            uVar9 = (ulong)(iVar6 + 1);
          }
          else {
            pdVar4[iVar6] =
                 pdVar4[iVar6] +
                 1.0 / ((auVar12._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)lVar11) - 4503599627370496.0));
            bVar5 = false;
          }
        } while (bVar5);
        pdVar10 = pdVar10 + 1;
      } while (pdVar10 < local_12c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish);
      uVar9 = (ulong)(int)uVar9;
    }
    dVar14 = (this->histList_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar9] *
             (this->bincenter_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar9] + this->averageDensity_;
  }
  else {
    iVar2._M_current =
         (this->bincenter_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (this->bincenter_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                ((vector<double,std::allocator<double>> *)&this->bincenter_,iVar2,&local_12a8);
    }
    else {
      *iVar2._M_current = local_12a8;
      (this->bincenter_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar2._M_current + 1;
    }
    lVar11 = (long)local_12c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_12c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3;
    auVar13._8_4_ =
         (int)((long)local_12c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_12c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start >> 0x23);
    auVar13._0_8_ = lVar11;
    auVar13._12_4_ = 0x45300000;
    local_12a0 = (auVar13._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)lVar11) - 4503599627370496.0);
    iVar2._M_current =
         (this->histList_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (this->histList_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                (&this->histList_,iVar2,&local_12a0);
      dVar14 = local_12a8;
    }
    else {
      *iVar2._M_current = local_12a0;
      (this->histList_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar2._M_current + 1;
      dVar14 = local_12a8;
    }
  }
  this->averageDensity_ = dVar14;
  (*(this->super_StaticAnalyser)._vptr_StaticAnalyser[4])(this);
  if (local_12c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_start != (double *)0x0) {
    operator_delete(local_12c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_12c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_12c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  DumpReader::~DumpReader(&local_1288);
  return;
}

Assistant:

void DensityHistogram::process() {
    StuntDouble* sd;
    int ii;

    if (evaluator_.isDynamic()) {
      seleMan_.setSelectionSet(evaluator_.evaluate());
    }

    DumpReader reader(info_, dumpFilename_);
    int nFrames = reader.getNFrames();
    nProcessed_ = nFrames / step_;
    vector<RealType> density;

    nProcessed_ = nFrames / step_;

    for (int istep = 0; istep < nFrames; istep += step_) {
      reader.readFrame(istep);
      currentSnapshot_ = info_->getSnapshotManager()->getCurrentSnapshot();

      for (sd = seleMan_.beginSelected(ii); sd != NULL;
           sd = seleMan_.nextSelected(ii)) {
        if (sd->getDensity()) density.push_back(sd->getDensity());
      }
    }

    if (density.empty()) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "Density for selected atom not found.\n");
      painCave.isFatal = 1;
      simError();
    }

    std::sort(density.begin(), density.end());

    RealType min = density.front();
    RealType max = density.back();

    RealType delta_density = (max - min) / (nBins_);
    averageDensity_        = 0;
    if (delta_density == 0) {
      bincenter_.push_back(min);
      histList_.push_back(density.size());
      averageDensity_ = min;
    } else {
      // fill the center for histogram
      for (int j = 0; j < nBins_ + 3; ++j) {
        bincenter_.push_back(min + (j - 1) * delta_density);
        histList_.push_back(0);
      }
      // filling up the histogram whith the densities
      int bin_center_pos = 0;
      vector<RealType>::iterator index;
      RealType density_length = static_cast<RealType>(density.size());

      bool hist_update;
      for (index = density.begin(); index < density.end(); index++) {
        hist_update = true;
        while (hist_update) {
          if (*index >= bincenter_[bin_center_pos] &&
              *index < bincenter_[bin_center_pos + 1]) {
            histList_[bin_center_pos] += 1.0 / density_length;
            hist_update = false;
          } else {
            averageDensity_ +=
                histList_[bin_center_pos] * bincenter_[bin_center_pos];
            bin_center_pos++;
            hist_update = true;
          }
        }
      }
      averageDensity_ += histList_[bin_center_pos] * bincenter_[bin_center_pos];
    }
    writeDensity();
  }